

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O2

void testing::internal::PrintOnOneLine(char *str,int max_length)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  
  if (str != (char *)0x0) {
    uVar3 = 0;
    while( true ) {
      cVar1 = *str;
      if (cVar1 == '\0') break;
      if (0xf9 < uVar3) {
        printf("...");
        return;
      }
      if (cVar1 == '\n') {
        printf("\\n");
        iVar2 = 2;
      }
      else {
        putchar((int)cVar1);
        iVar2 = 1;
      }
      uVar3 = uVar3 + iVar2;
      str = str + 1;
    }
  }
  return;
}

Assistant:

static void PrintOnOneLine(const char* str, int max_length) {
  if (str != NULL) {
    for (int i = 0; *str != '\0'; ++str) {
      if (i >= max_length) {
        printf("...");
        break;
      }
      if (*str == '\n') {
        printf("\\n");
        i += 2;
      } else {
        printf("%c", *str);
        ++i;
      }
    }
  }
}